

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  cmOutputConverter *this_00;
  cmState *this_01;
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  pointer ppcVar7;
  cmGlobalUnixMakefileGenerator3 *this_02;
  pointer puVar8;
  cmGeneratorTarget *gtarget;
  ostream *local_360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string localName;
  string makeTargetName;
  string makefileName;
  string local_2a8;
  string tmp;
  EchoProgress progress;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string name;
  string local_1c8;
  ostringstream progressArg;
  
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  localName._M_dataplus._M_p = (pointer)&localName.field_2;
  localName._M_string_length = 0;
  localName.field_2._M_local_buf[0] = '\0';
  makeTargetName._M_dataplus._M_p = (pointer)&makeTargetName.field_2;
  makeTargetName._M_string_length = 0;
  makeTargetName.field_2._M_local_buf[0] = '\0';
  local_360 = ruleFileStream;
  WriteDirectoryRules2(this,ruleFileStream,lg);
  std::__cxx11::string::string
            ((string *)&progressArg,"cmake_check_build_system",(allocator *)&progress);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&progressArg);
  std::__cxx11::string::~string((string *)&progressArg);
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            (&targets,&(lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets);
  this_00 = &(lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  ppcVar7 = targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppcVar7 ==
        targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
                (&targets.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>);
      std::__cxx11::string::~string((string *)&makeTargetName);
      std::__cxx11::string::~string((string *)&localName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      return;
    }
    gtarget = *ppcVar7;
    TVar2 = cmGeneratorTarget::GetType(gtarget);
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(gtarget);
    std::__cxx11::string::string((string *)&name,(string *)psVar3);
    if ((TVar2 < GLOBAL_TARGET) && (name._M_string_length != 0)) {
      makefileName._M_dataplus._M_p = (pointer)&makefileName.field_2;
      makefileName._M_string_length = 0;
      makefileName.field_2._M_local_buf[0] = '\0';
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                ((string *)&progressArg,lg,gtarget);
      std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      this_02 = (cmGlobalUnixMakefileGenerator3 *)&makefileName;
      std::__cxx11::string::_M_assign((string *)this_02);
      std::__cxx11::string::append((char *)this_02);
      bVar1 = NeedRequiresStep(this_02,gtarget);
      cmLocalUnixMakefileGenerator3::WriteDivider(lg,local_360);
      poVar4 = std::operator<<(local_360,"# Target rules for target ");
      poVar4 = std::operator<<(poVar4,(string *)&localName);
      std::operator<<(poVar4,"\n\n");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      std::__cxx11::string::_M_assign((string *)&makeTargetName);
      std::__cxx11::string::append((char *)&makeTargetName);
      cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                ((string *)&progressArg,lg,makefileName._M_dataplus._M_p,&makeTargetName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 (string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)&makeTargetName);
        std::__cxx11::string::append((char *)&makeTargetName);
        cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                  ((string *)&progressArg,lg,makefileName._M_dataplus._M_p,&makeTargetName);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                   (string *)&progressArg);
        std::__cxx11::string::~string((string *)&progressArg);
      }
      std::__cxx11::string::_M_assign((string *)&makeTargetName);
      std::__cxx11::string::append((char *)&makeTargetName);
      cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                ((string *)&progressArg,lg,makefileName._M_dataplus._M_p,&makeTargetName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 (string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      std::__cxx11::string::append((char *)&localName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&depends);
      progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
      progress.Dir._M_string_length = 0;
      progress.Dir.field_2._M_local_buf[0] = '\0';
      progress.Arg._M_dataplus._M_p = (pointer)&progress.Arg.field_2;
      progress.Arg._M_string_length = 0;
      progress.Arg.field_2._M_local_buf[0] = '\0';
      cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)lg);
      std::__cxx11::string::assign((char *)&progress);
      std::__cxx11::string::append((char *)&progress);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
      pmVar5 = std::
               map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
               ::operator[](&this->ProgressMap,&gtarget);
      pcVar6 = "";
      for (puVar8 = (pmVar5->Marks).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar8 != (pmVar5->Marks).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish; puVar8 = puVar8 + 1) {
        poVar4 = std::operator<<((ostream *)&progressArg,pcVar6);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        pcVar6 = ",";
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&progress.Arg,(string *)&tmp);
      std::__cxx11::string::~string((string *)&tmp);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
      this_01 = ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)->State
      ;
      std::__cxx11::string::string((string *)&progressArg,"TARGET_MESSAGES",(allocator *)&tmp);
      pcVar6 = cmState::GetGlobalProperty(this_01,(string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      if (pcVar6 == (char *)0x0) {
LAB_0039439c:
        std::operator+((string *)&progressArg,"Built target ",&name);
        cmLocalUnixMakefileGenerator3::AppendEcho
                  (lg,&commands,(string *)&progressArg,EchoNormal,&progress);
        std::__cxx11::string::~string((string *)&progressArg);
      }
      else {
        bVar1 = cmSystemTools::IsOn(pcVar6);
        if (bVar1) goto LAB_0039439c;
      }
      AppendGlobalTargetDepends(this,&depends,gtarget);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,local_360,"All Build rule for target.",&localName,&depends,&commands,true,false)
      ;
      bVar1 = cmGlobalGenerator::IsExcluded
                        ((cmGlobalGenerator *)this,
                         *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          LocalGenerators.
                          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,gtarget);
      if (!bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&depends);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&localName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&commands);
        std::__cxx11::string::string((string *)&progressArg,"all",(allocator *)&tmp);
        cmLocalUnixMakefileGenerator3::WriteMakeRule
                  (lg,local_360,"Include target in all.",(string *)&progressArg,&depends,&commands,
                   true,false);
        std::__cxx11::string::~string((string *)&progressArg);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
      std::operator<<((ostream *)&progressArg,"$(CMAKE_COMMAND) -E cmake_progress_start ");
      cmsys::SystemTools::CollapseFullPath(&local_2a8,&progress.Dir);
      cmOutputConverter::ConvertToOutputFormat(&tmp,this_00,&local_2a8,SHELL);
      std::operator<<((ostream *)&progressArg,(string *)&tmp);
      std::__cxx11::string::~string((string *)&tmp);
      std::__cxx11::string::~string((string *)&local_2a8);
      tmp._M_string_length._0_4_ = 0;
      tmp.field_2._M_allocated_capacity = 0;
      tmp.field_2._8_8_ = &tmp._M_string_length;
      poVar4 = std::operator<<((ostream *)&progressArg," ");
      CountProgressMarksInTarget
                (this,gtarget,
                 (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *)&tmp);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 &local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                   *)&tmp);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
      std::__cxx11::string::string((string *)&tmp,"CMakeFiles/",(allocator *)&progressArg);
      std::__cxx11::string::append((char *)&tmp);
      cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                ((string *)&progressArg,lg,tmp._M_dataplus._M_p,&localName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 (string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
      std::operator<<((ostream *)&progressArg,"$(CMAKE_COMMAND) -E cmake_progress_start ");
      cmsys::SystemTools::CollapseFullPath(&local_1c8,&progress.Dir);
      cmOutputConverter::ConvertToOutputFormat(&local_2a8,this_00,&local_1c8,SHELL);
      std::operator<<((ostream *)&progressArg,(string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::operator<<((ostream *)&progressArg," 0");
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 &local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&depends);
      std::__cxx11::string::string
                ((string *)&progressArg,"cmake_check_build_system",(allocator *)&local_2a8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                 (string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                ((string *)&progressArg,lg,gtarget);
      std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      std::__cxx11::string::append((char *)&localName);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,local_360,"Build rule for subdir invocation for target.",&localName,&depends,
                 &commands,true,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&depends);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,&localName);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,local_360,"Convenience name for target.",&name,&depends,&commands,true,false);
      bVar1 = cmGeneratorTarget::NeedRelinkBeforeInstall
                        (gtarget,&(lg->super_cmLocalCommonGenerator).ConfigName);
      if (bVar1) {
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  ((string *)&progressArg,lg,gtarget);
        std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
        std::__cxx11::string::~string((string *)&progressArg);
        std::__cxx11::string::append((char *)&localName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&depends);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&commands);
        cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                  ((string *)&progressArg,lg,makefileName._M_dataplus._M_p,&localName);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                   (string *)&progressArg);
        std::__cxx11::string::~string((string *)&progressArg);
        cmLocalUnixMakefileGenerator3::WriteMakeRule
                  (lg,local_360,"Pre-install relink rule for target.",&localName,&depends,&commands,
                   true,false);
        bVar1 = cmGlobalGenerator::IsExcluded
                          ((cmGlobalGenerator *)this,
                           *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                            LocalGenerators.
                            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,gtarget);
        if (!bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&depends);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,&localName);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&commands);
          std::__cxx11::string::string((string *)&progressArg,"preinstall",(allocator *)&local_2a8);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (lg,local_360,"Prepare target for install.",(string *)&progressArg,&depends,
                     &commands,true,false);
          std::__cxx11::string::~string((string *)&progressArg);
        }
      }
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                ((string *)&progressArg,lg,gtarget);
      std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      std::__cxx11::string::_M_assign((string *)&makeTargetName);
      std::__cxx11::string::append((char *)&makeTargetName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&depends);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                ((string *)&progressArg,lg,makefileName._M_dataplus._M_p,&makeTargetName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 (string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,local_360,"clean rule for target.",&makeTargetName,&depends,&commands,true,false
                );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,&makeTargetName);
      std::__cxx11::string::string((string *)&progressArg,"clean",(allocator *)&local_2a8);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,local_360,"clean rule for target.",(string *)&progressArg,&depends,&commands,
                 true,false);
      std::__cxx11::string::~string((string *)&progressArg);
      std::__cxx11::string::~string((string *)&tmp);
      cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress(&progress);
      std::__cxx11::string::~string((string *)&makefileName);
    }
    std::__cxx11::string::~string((string *)&name);
    ppcVar7 = ppcVar7 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  std::vector<std::string> depends;
  std::vector<std::string> commands;
  std::string localName;
  std::string makeTargetName;

  // write the directory level rules for this local gen
  this->WriteDirectoryRules2(ruleFileStream, lg);

  depends.push_back("cmake_check_build_system");

  // for each target Generate the rule files for each target.
  std::vector<cmGeneratorTarget*> targets = lg->GetGeneratorTargets();
  for (std::vector<cmGeneratorTarget*>::iterator t = targets.begin();
       t != targets.end(); ++t) {
    cmGeneratorTarget* gtarget = *t;
    int type = gtarget->GetType();
    std::string name = gtarget->GetName();
    if (!name.empty() && ((type == cmStateEnums::EXECUTABLE) ||
                          (type == cmStateEnums::STATIC_LIBRARY) ||
                          (type == cmStateEnums::SHARED_LIBRARY) ||
                          (type == cmStateEnums::MODULE_LIBRARY) ||
                          (type == cmStateEnums::OBJECT_LIBRARY) ||
                          (type == cmStateEnums::UTILITY))) {
      std::string makefileName;
      // Add a rule to build the target by name.
      localName = lg->GetRelativeTargetDirectory(gtarget);
      makefileName = localName;
      makefileName += "/build.make";

      bool needRequiresStep = this->NeedRequiresStep(gtarget);

      lg->WriteDivider(ruleFileStream);
      ruleFileStream << "# Target rules for target " << localName << "\n\n";

      commands.clear();
      makeTargetName = localName;
      makeTargetName += "/depend";
      commands.push_back(
        lg->GetRecursiveMakeCall(makefileName.c_str(), makeTargetName));

      // add requires if we need it for this generator
      if (needRequiresStep) {
        makeTargetName = localName;
        makeTargetName += "/requires";
        commands.push_back(
          lg->GetRecursiveMakeCall(makefileName.c_str(), makeTargetName));
      }
      makeTargetName = localName;
      makeTargetName += "/build";
      commands.push_back(
        lg->GetRecursiveMakeCall(makefileName.c_str(), makeTargetName));

      // Write the rule.
      localName += "/all";
      depends.clear();

      cmLocalUnixMakefileGenerator3::EchoProgress progress;
      progress.Dir = lg->GetBinaryDirectory();
      progress.Dir += cmake::GetCMakeFilesDirectory();
      {
        std::ostringstream progressArg;
        const char* sep = "";
        std::vector<unsigned long>& progFiles =
          this->ProgressMap[gtarget].Marks;
        for (std::vector<unsigned long>::iterator i = progFiles.begin();
             i != progFiles.end(); ++i) {
          progressArg << sep << *i;
          sep = ",";
        }
        progress.Arg = progressArg.str();
      }

      bool targetMessages = true;
      if (const char* tgtMsg =
            this->GetCMakeInstance()->GetState()->GetGlobalProperty(
              "TARGET_MESSAGES")) {
        targetMessages = cmSystemTools::IsOn(tgtMsg);
      }

      if (targetMessages) {
        lg->AppendEcho(commands, "Built target " + name,
                       cmLocalUnixMakefileGenerator3::EchoNormal, &progress);
      }

      this->AppendGlobalTargetDepends(depends, gtarget);
      lg->WriteMakeRule(ruleFileStream, "All Build rule for target.",
                        localName, depends, commands, true);

      // add the all/all dependency
      if (!this->IsExcluded(this->LocalGenerators[0], gtarget)) {
        depends.clear();
        depends.push_back(localName);
        commands.clear();
        lg->WriteMakeRule(ruleFileStream, "Include target in all.", "all",
                          depends, commands, true);
      }

      // Write the rule.
      commands.clear();

      {
        // TODO: Convert the total progress count to a make variable.
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start ";
        // # in target
        progCmd << lg->ConvertToOutputFormat(
          cmSystemTools::CollapseFullPath(progress.Dir),
          cmOutputConverter::SHELL);
        //
        std::set<cmGeneratorTarget const*> emitted;
        progCmd << " " << this->CountProgressMarksInTarget(gtarget, emitted);
        commands.push_back(progCmd.str());
      }
      std::string tmp = cmake::GetCMakeFilesDirectoryPostSlash();
      tmp += "Makefile2";
      commands.push_back(lg->GetRecursiveMakeCall(tmp.c_str(), localName));
      {
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start "; // # 0
        progCmd << lg->ConvertToOutputFormat(
          cmSystemTools::CollapseFullPath(progress.Dir),
          cmOutputConverter::SHELL);
        progCmd << " 0";
        commands.push_back(progCmd.str());
      }
      depends.clear();
      depends.push_back("cmake_check_build_system");
      localName = lg->GetRelativeTargetDirectory(gtarget);
      localName += "/rule";
      lg->WriteMakeRule(ruleFileStream,
                        "Build rule for subdir invocation for target.",
                        localName, depends, commands, true);

      // Add a target with the canonical name (no prefix, suffix or path).
      commands.clear();
      depends.clear();
      depends.push_back(localName);
      lg->WriteMakeRule(ruleFileStream, "Convenience name for target.", name,
                        depends, commands, true);

      // Add rules to prepare the target for installation.
      if (gtarget->NeedRelinkBeforeInstall(lg->GetConfigName())) {
        localName = lg->GetRelativeTargetDirectory(gtarget);
        localName += "/preinstall";
        depends.clear();
        commands.clear();
        commands.push_back(
          lg->GetRecursiveMakeCall(makefileName.c_str(), localName));
        lg->WriteMakeRule(ruleFileStream,
                          "Pre-install relink rule for target.", localName,
                          depends, commands, true);

        if (!this->IsExcluded(this->LocalGenerators[0], gtarget)) {
          depends.clear();
          depends.push_back(localName);
          commands.clear();
          lg->WriteMakeRule(ruleFileStream, "Prepare target for install.",
                            "preinstall", depends, commands, true);
        }
      }

      // add the clean rule
      localName = lg->GetRelativeTargetDirectory(gtarget);
      makeTargetName = localName;
      makeTargetName += "/clean";
      depends.clear();
      commands.clear();
      commands.push_back(
        lg->GetRecursiveMakeCall(makefileName.c_str(), makeTargetName));
      lg->WriteMakeRule(ruleFileStream, "clean rule for target.",
                        makeTargetName, depends, commands, true);
      commands.clear();
      depends.push_back(makeTargetName);
      lg->WriteMakeRule(ruleFileStream, "clean rule for target.", "clean",
                        depends, commands, true);
    }
  }
}